

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O1

void __thiscall ElfFile::loadSectionNames(ElfFile *this)

{
  byte bVar1;
  ElfSection *pEVar2;
  pointer ppEVar3;
  ulong uVar4;
  ulong uVar5;
  string strName;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  uVar5 = (ulong)(this->fileHeader).e_shstrndx;
  if (uVar5 != 0) {
    pEVar2 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar5];
    uVar5 = (ulong)(pEVar2->header).sh_size;
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        bVar1 = (this->fileData).data_[uVar4 + (pEVar2->header).sh_offset];
        if ((char)bVar1 < '\0') {
          return;
        }
        if ((byte)(bVar1 - 1) < 0x1f) {
          return;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar3) {
      uVar5 = 0;
      do {
        pEVar2 = ppEVar3[uVar5];
        if ((pEVar2->header).sh_type != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_50,
                     (char *)((this->fileData).data_ +
                             (int)((pEVar2->header).sh_name +
                                  (ppEVar3[(this->fileHeader).e_shstrndx]->header).sh_offset)),
                     &local_51);
          std::__cxx11::string::_M_assign((string *)&pEVar2->name);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        uVar5 = uVar5 + 1;
        ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->sections).
                                     super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3
                              ));
    }
  }
  return;
}

Assistant:

void ElfFile::loadSectionNames()
{
	if (fileHeader.e_shstrndx == SHN_UNDEF) return;

	// check if the string table is actually a string table
	// sometimes it gives the wrong section id
	size_t strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
	size_t strTableSize = sections[fileHeader.e_shstrndx]->getSize();
	for (size_t i = 0; i < strTableSize; i++)
	{
		if (fileData[strTablePos+i] != 0 && fileData[strTablePos+i] < 0x20)
			return;
		if (fileData[strTablePos+i] > 0x7F)
			return;
	}

	for (size_t i = 0; i < sections.size(); i++)
	{
		ElfSection* section = sections[i];
		if (section->getType() == SHT_NULL) continue;

		int strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
		int offset = strTablePos+section->getNameOffset();

		char* name = (char*) fileData.data(offset);
		std::string strName = name;
		section->setName(strName);
	}
}